

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

void __thiscall
SVGChart::PlotDataContainer::AddXYPlot
          (PlotDataContainer *this,PlotDataBase *inXData,PlotDataBase *inYData,
          LegendData *inLegendData,DataDrawerBase *inDataDrawer,
          PlotDataSelection *inPlotDataSelection)

{
  pointer *pppPVar1;
  pointer *pppLVar2;
  pointer *pppDVar3;
  pointer *pppPVar4;
  _Rb_tree_header *p_Var5;
  iterator iVar6;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DummyData *this_00;
  long inSize;
  size_type __new_size;
  PlotDataSelection *thePlotDataSelection;
  DataDrawerBase *theDataDrawer;
  LegendData *theLegendData;
  PlotDataBase *theXData;
  PlotDataBase *local_50;
  PlotDataSelection *local_48;
  DataDrawerBase *local_40;
  LegendData *local_38;
  DummyData *local_30;
  
  if (inYData != (PlotDataBase *)0x0) {
    local_50 = inYData;
    iVar7 = (*inYData->_vptr_PlotDataBase[2])(inYData);
    if ((CONCAT44(extraout_var,iVar7) == 0) &&
       (iVar7 = (*local_50->_vptr_PlotDataBase[3])(), CONCAT44(extraout_var_00,iVar7) == 0)) {
      return;
    }
    local_30 = (DummyData *)inXData;
    if (inXData == (PlotDataBase *)0x0) {
      local_30 = (DummyData *)inXData;
      this_00 = (DummyData *)operator_new(0x20);
      inSize = PlotDataBase::GetSize(local_50);
      DummyData::DummyData(this_00,inSize);
      local_30 = this_00;
    }
    iVar6._M_current =
         (this->mXDataList).
         super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->mXDataList).
        super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<SVGChart::PlotDataBase*,std::allocator<SVGChart::PlotDataBase*>>::
      _M_realloc_insert<SVGChart::PlotDataBase*const&>
                ((vector<SVGChart::PlotDataBase*,std::allocator<SVGChart::PlotDataBase*>> *)this,
                 iVar6,(PlotDataBase **)&local_30);
    }
    else {
      *iVar6._M_current = &local_30->super_PlotDataBase;
      pppPVar1 = &(this->mXDataList).
                  super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
    iVar6._M_current =
         (this->mYDataList).
         super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar6._M_current ==
        (this->mYDataList).
        super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<SVGChart::PlotDataBase*,std::allocator<SVGChart::PlotDataBase*>>::
      _M_realloc_insert<SVGChart::PlotDataBase*const&>
                ((vector<SVGChart::PlotDataBase*,std::allocator<SVGChart::PlotDataBase*>> *)
                 &this->mYDataList,iVar6,&local_50);
    }
    else {
      *iVar6._M_current = local_50;
      pppPVar1 = &(this->mYDataList).
                  super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppPVar1 = *pppPVar1 + 1;
    }
    local_38 = inLegendData;
    if (inLegendData == (LegendData *)0x0) {
      local_38 = (LegendData *)operator_new(0xa8);
      (local_38->mName)._M_dataplus._M_p = (pointer)&(local_38->mName).field_2;
      (local_38->mName)._M_string_length = 0;
      (local_38->mName).field_2._M_local_buf[0] = '\0';
      (local_38->mColor).mR = '\0';
      (local_38->mColor).mG = '\0';
      (local_38->mColor).mB = '\0';
      local_38->mShow = true;
      (local_38->mStyle).mFontSize = 10;
      (local_38->mStyle).mFont._M_dataplus._M_p = (pointer)&(local_38->mStyle).mFont.field_2;
      (local_38->mStyle).mFont._M_string_length = 0;
      (local_38->mStyle).mFont.field_2._M_local_buf[0] = '\0';
      (local_38->mStyle).mPenWidth = 1;
      (local_38->mStyle).mPenStyle._M_dataplus._M_p = (pointer)&(local_38->mStyle).mPenStyle.field_2
      ;
      (local_38->mStyle).mPenStyle._M_string_length = 0;
      (local_38->mStyle).mPenStyle.field_2._M_local_buf[0] = '\0';
      p_Var5 = &(local_38->mStyle).mVar._M_t._M_impl.super__Rb_tree_header;
      (local_38->mStyle).mVar._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      (local_38->mStyle).mVar._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (local_38->mStyle).mVar._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var5->_M_header;
      (local_38->mStyle).mVar._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var5->_M_header;
      (local_38->mStyle).mVar._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      LegendData::SetDefaultValues
                (local_38,(int)((ulong)((long)(this->mLegendDataList).
                                              super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(this->mLegendDataList).
                                             super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3));
    }
    __position._M_current =
         (this->mLegendDataList).
         super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->mLegendDataList).
        super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<SVGChart::LegendData*,std::allocator<SVGChart::LegendData*>>::
      _M_realloc_insert<SVGChart::LegendData*const&>
                ((vector<SVGChart::LegendData*,std::allocator<SVGChart::LegendData*>> *)
                 &this->mLegendDataList,__position,&local_38);
    }
    else {
      *__position._M_current = local_38;
      pppLVar2 = &(this->mLegendDataList).
                  super__Vector_base<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppLVar2 = *pppLVar2 + 1;
    }
    local_40 = inDataDrawer;
    if (inDataDrawer == (DataDrawerBase *)0x0) {
      local_40 = (DataDrawerBase *)operator_new(0xa8);
      local_40->mXTrafo = (Trafo *)0x0;
      local_40->mYTrafo = (Trafo *)0x0;
      local_40->mDrawFast = false;
      local_40->mPlotCount = 1;
      local_40->mPlotIndex = 0;
      local_40->_vptr_DataDrawerBase = (_func_int **)&PTR__LineDataDrawer_00112818;
      *(undefined2 *)&local_40->field_0x24 = 1;
      *(undefined4 *)&local_40[1]._vptr_DataDrawerBase = 10;
      local_40[1].mXTrafo = (Trafo *)&local_40[1].mDrawFast;
      local_40[1].mYTrafo = (Trafo *)0x0;
      local_40[1].mDrawFast = false;
      *(undefined4 *)&local_40[2]._vptr_DataDrawerBase = 1;
      local_40[2].mXTrafo = (Trafo *)&local_40[2].mDrawFast;
      local_40[2].mYTrafo = (Trafo *)0x0;
      local_40[2].mDrawFast = false;
      *(undefined4 *)&local_40[3].mXTrafo = 0;
      local_40[3].mYTrafo = (Trafo *)0x0;
      *(Trafo ***)&local_40[3].mDrawFast = &local_40[3].mXTrafo;
      *(Trafo ***)&local_40[3].mPlotIndex = &local_40[3].mXTrafo;
      local_40[4]._vptr_DataDrawerBase = (_func_int **)0x0;
    }
    __position_00._M_current =
         (this->mDataDrawerList).
         super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->mDataDrawerList).
        super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<SVGChart::DataDrawerBase*,std::allocator<SVGChart::DataDrawerBase*>>::
      _M_realloc_insert<SVGChart::DataDrawerBase*const&>
                ((vector<SVGChart::DataDrawerBase*,std::allocator<SVGChart::DataDrawerBase*>> *)
                 &this->mDataDrawerList,__position_00,&local_40);
    }
    else {
      *__position_00._M_current = local_40;
      pppDVar3 = &(this->mDataDrawerList).
                  super__Vector_base<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppDVar3 = *pppDVar3 + 1;
    }
    local_48 = inPlotDataSelection;
    if (inPlotDataSelection == (PlotDataSelection *)0x0) {
      local_48 = (PlotDataSelection *)operator_new(0x18);
      (local_48->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      (local_48->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      (local_48->super_vector<int,_std::allocator<int>_>).
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
    }
    else {
      __new_size = PlotDataBase::GetSize(local_50);
      std::vector<int,_std::allocator<int>_>::resize
                (&inPlotDataSelection->super_vector<int,_std::allocator<int>_>,__new_size);
    }
    __position_01._M_current =
         (this->mPlotDataSelectionList).
         super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_01._M_current ==
        (this->mPlotDataSelectionList).
        super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<SVGChart::PlotDataSelection*,std::allocator<SVGChart::PlotDataSelection*>>::
      _M_realloc_insert<SVGChart::PlotDataSelection*const&>
                ((vector<SVGChart::PlotDataSelection*,std::allocator<SVGChart::PlotDataSelection*>>
                  *)&this->mPlotDataSelectionList,__position_01,&local_48);
    }
    else {
      *__position_01._M_current = local_48;
      pppPVar4 = &(this->mPlotDataSelectionList).
                  super__Vector_base<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppPVar4 = *pppPVar4 + 1;
    }
  }
  return;
}

Assistant:

void PlotDataContainer::AddXYPlot (PlotDataBase *inXData, PlotDataBase *inYData, LegendData *inLegendData, DataDrawerBase *inDataDrawer, PlotDataSelection *inPlotDataSelection) {
      if (!inYData || (!inYData->GetRealPlotData () && !inYData->GetCalculatedData ())) {
        return;
      }
      PlotDataBase *theXData = inXData;
      if (!theXData) {
        theXData = new DummyData (inYData->GetSize ());
      }
      mXDataList.push_back (theXData);
      mYDataList.push_back (inYData);

      LegendData *theLegendData = inLegendData;
      if (!theLegendData) {
        theLegendData = new LegendData ();
        theLegendData->SetDefaultValues (mLegendDataList.size ());
      }
      mLegendDataList.push_back (theLegendData);

      DataDrawerBase *theDataDrawer = inDataDrawer;
      if (!theDataDrawer) {
        theDataDrawer = new LineDataDrawer ();
      }
      mDataDrawerList.push_back (theDataDrawer);

      PlotDataSelection *thePlotDataSelection = inPlotDataSelection;
      if (!thePlotDataSelection) {
        thePlotDataSelection = new PlotDataSelection ();
      }
      else {
        thePlotDataSelection->resize (inYData->GetSize ());
      }
      mPlotDataSelectionList.push_back (thePlotDataSelection);
    }